

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_9::DiskFile::copy(DiskFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint __fd;
  EVP_PKEY_CTX *pEVar1;
  DiskHandle *pDVar2;
  Fault FVar3;
  EVP_PKEY_CTX *pEVar4;
  int iVar5;
  int iVar6;
  Exception *pEVar7;
  __off64_t _Var8;
  ssize_t sVar9;
  size_t __n;
  ulong uVar10;
  Exception *in_RCX;
  stat *__buf;
  stat *__buf_00;
  ulong uVar11;
  size_t __nbytes;
  ulong in_R8;
  Exception *pEVar12;
  DiskHandle *this_00;
  Exception *pEVar13;
  uint64_t size;
  Fault f_2;
  Fault f;
  byte buffer [4096];
  Fault local_1090;
  Fault local_1088;
  undefined8 uStack_1080;
  ulong local_1078;
  EVP_PKEY_CTX *local_1070;
  EVP_PKEY_CTX *local_1060;
  ulong local_1058;
  EVP_PKEY_CTX *local_1050;
  DiskHandle *local_1048;
  ulong local_1040;
  Fault local_1038;
  long lStack_1030;
  
  (*(code *)**(undefined8 **)src)(&local_1038,src);
  if ((char)local_1038.exception != '\x01') {
    iVar5 = File::copy(&this->super_File,dst,src);
    return iVar5;
  }
  this_00 = &this->super_DiskHandle;
  __fd = local_1038.exception._4_4_;
  pEVar12 = (Exception *)(long)(int)local_1038.exception._4_4_;
  pEVar13 = in_RCX;
  if (in_R8 == 0xffffffffffffffff && (in_RCX == (Exception *)0x0 && dst == (EVP_PKEY_CTX *)0x0)) {
    DiskHandle::stat((DiskHandle *)&local_1038,(char *)this_00,__buf);
    if (lStack_1030 == 0) {
      iVar5 = ioctl((this_00->fd).fd,0x40049409,(ulong)__fd);
      if (-1 < iVar5) {
        DiskHandle::stat((DiskHandle *)&local_1038,(char *)this_00,__buf_00);
        return (int)lStack_1030;
      }
      pEVar12 = (Exception *)0x7fffffffffffffff;
      goto LAB_004cd2ef;
    }
  }
  else if (in_R8 == 0) {
    return 0;
  }
  local_1078 = 0;
  if (in_R8 != 0xffffffffffffffff) {
    local_1078 = in_R8;
  }
  local_1088.exception = pEVar12;
  local_1070 = dst;
  iVar5 = ioctl((this_00->fd).fd,0x4020940d);
  if (-1 < iVar5) {
    (**(code **)(*(long *)src + 0x10))(&local_1038,src);
    uVar11 = lStack_1030 - (long)in_RCX;
    if (in_R8 <= (ulong)(lStack_1030 - (long)in_RCX)) {
      uVar11 = in_R8;
    }
    return (int)uVar11;
  }
  pEVar12 = (Exception *)0x7fffffffffffffff;
  if (in_R8 != 0xffffffffffffffff) {
    pEVar12 = (Exception *)((long)in_RCX->trace + (in_R8 - 0x68));
  }
LAB_004cd2ef:
  pEVar7 = (Exception *)lseek64(__fd,(__off64_t)pEVar13,4);
  iVar5 = (int)in_RCX;
  if ((long)pEVar7 < 0) {
    iVar6 = kj::_::Debug::getOsErrorNumber(false);
    if (iVar6 == -1) goto LAB_004cd2ef;
    if ((iVar6 != 0) && (pEVar7 = pEVar12, iVar6 != 0x16)) {
      if (iVar6 == 6) goto LAB_004cd5cb;
      goto LAB_004cd650;
    }
  }
  if ((long)pEVar12 < (long)pEVar7) {
    pEVar7 = pEVar12;
  }
  uVar11 = (long)pEVar7 - (long)pEVar13;
  if ((long)pEVar7 - (long)pEVar13 != 0) {
    do {
      local_1058 = uVar11;
      _Var8 = lseek64((this_00->fd).fd,(__off64_t)dst,0);
      pEVar1 = dst;
      pDVar2 = this_00;
      FVar3.exception = pEVar13;
      if (-1 < _Var8) goto joined_r0x004cd37c;
      iVar6 = kj::_::Debug::getOsErrorNumber(false);
      uVar11 = local_1058;
    } while (iVar6 == -1);
    pEVar1 = dst;
    if (iVar6 != 0) {
      local_1088.exception = (Exception *)0x0;
      local_1038.exception = (Exception *)0x0;
      lStack_1030 = 0;
      kj::_::Debug::Fault::init
                (&local_1088,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_1088);
    }
joined_r0x004cd37c:
    local_1088.exception = FVar3.exception;
    local_1048 = pDVar2;
    local_1060 = pEVar1;
    if ((long)local_1088.exception < (long)pEVar7) goto LAB_004cd37e;
    goto LAB_004cd3cc;
  }
  goto LAB_004cd3f2;
LAB_004cd37e:
  sVar9 = sendfile64((this_00->fd).fd,__fd,(__off64_t *)&local_1088,
                     (long)pEVar7 - (long)local_1088.exception);
  if (sVar9 < 0) {
    iVar6 = kj::_::Debug::getOsErrorNumber(false);
    if (iVar6 < 0) goto LAB_004cd3c2;
    pEVar1 = local_1060;
    pDVar2 = local_1048;
    FVar3.exception = local_1088.exception;
    if (iVar6 == 0) goto joined_r0x004cd37c;
    if ((iVar6 != 0x16) && (iVar6 != 0x26)) goto LAB_004cd570;
    uVar11 = 0;
    pEVar7 = pEVar13;
    pEVar4 = local_1060;
    uVar10 = local_1058;
    pEVar1 = local_1050;
    goto joined_r0x004cd4b6;
  }
  pEVar1 = local_1060;
  pDVar2 = local_1048;
  FVar3.exception = local_1088.exception;
  if (sVar9 == 0) {
LAB_004cd3cc:
    uVar11 = (long)local_1088.exception - (long)pEVar13;
    pEVar1 = local_1050;
    goto LAB_004cd3cf;
  }
  goto joined_r0x004cd37c;
LAB_004cd3c2:
  if (iVar6 != -1) {
LAB_004cd570:
    local_1090.exception = (Exception *)0x0;
    local_1038.exception = (Exception *)0x0;
    lStack_1030 = 0;
    kj::_::Debug::Fault::init
              (&local_1090,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    uVar11 = (long)local_1088.exception - (long)pEVar13;
    kj::_::Debug::Fault::~Fault(&local_1090);
    pEVar1 = local_1050;
    goto LAB_004cd3cf;
  }
  goto LAB_004cd37e;
joined_r0x004cd4b6:
  local_1050 = pEVar4;
  if (uVar10 == 0) goto LAB_004cd3cf;
  memset(&local_1038,0,0x1000);
  __nbytes = 0x1000;
  local_1040 = uVar10;
  if (uVar10 < 0x1000) {
    __nbytes = uVar10;
  }
  do {
    __n = pread64(__fd,&local_1038,__nbytes,(__off64_t)pEVar7);
    if (-1 < (long)__n) {
      pEVar1 = local_1050;
      if (__n != 0) goto LAB_004cd539;
      goto LAB_004cd3cf;
    }
    iVar6 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar6 == -1);
  if (iVar6 != 0) {
    local_1090.exception = (Exception *)0x0;
    local_1088.exception = (Exception *)0x0;
    uStack_1080 = 0;
    kj::_::Debug::Fault::init
              (&local_1090,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_1090);
  }
LAB_004cd539:
  pEVar1 = local_1050;
  DiskHandle::write(local_1048,(int)local_1050,&local_1038,__n);
  pEVar7 = (Exception *)((long)pEVar7->trace + (__n - 0x68));
  uVar11 = uVar11 + __n;
  uVar10 = local_1040 - __n;
  pEVar4 = pEVar1 + __n;
  pEVar1 = local_1050;
  goto joined_r0x004cd4b6;
LAB_004cd3cf:
  local_1050 = pEVar1;
  pEVar13 = (Exception *)((long)pEVar13->trace + (uVar11 - 0x68));
  if (uVar11 < local_1058) {
LAB_004cd5cb:
    return (int)pEVar13 - iVar5;
  }
  dst = local_1060 + uVar11;
  this_00 = local_1048;
LAB_004cd3f2:
  if (pEVar13 == pEVar12) goto LAB_004cd679;
  do {
    pEVar7 = (Exception *)lseek64(__fd,(__off64_t)pEVar13,3);
    if (-1 < (long)pEVar7) goto LAB_004cd45e;
    iVar6 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar6 == -1);
  if (iVar6 != 0) {
    if (iVar6 != 6) {
      if (iVar6 == 0x16) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                  (&local_1038,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x27b,FAILED,(char *)0x0,
                   "\"can\'t determine hole size; SEEK_DATA not supported\"",
                   (char (*) [51])"can\'t determine hole size; SEEK_DATA not supported");
        kj::_::Debug::Fault::fatal(&local_1038);
      }
LAB_004cd650:
      lStack_1030 = 0;
      local_1038.exception = (Exception *)0x0;
      local_1088.exception = (Exception *)0x0;
      kj::_::Debug::Fault::init
                (&local_1088,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::~Fault(&local_1088);
      return (int)pEVar13 - iVar5;
    }
    do {
      pEVar7 = (Exception *)lseek64(__fd,0,2);
      if (-1 < (long)pEVar7) goto LAB_004cd457;
      iVar6 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar6 == -1);
    if (iVar6 != 0) {
      local_1088.exception = (Exception *)0x0;
      local_1038.exception = (Exception *)0x0;
      lStack_1030 = 0;
      kj::_::Debug::Fault::init
                (&local_1088,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_1088);
    }
LAB_004cd457:
    if ((long)pEVar12 < (long)pEVar7) {
      pEVar12 = pEVar7;
    }
  }
LAB_004cd45e:
  if ((long)pEVar12 < (long)pEVar7) {
    pEVar7 = pEVar12;
  }
  size = (long)pEVar7 - (long)pEVar13;
  if (size != 0 && (long)pEVar13 <= (long)pEVar7) {
    DiskHandle::zero(this_00,(uint64_t)dst,size);
    dst = dst + size;
    pEVar13 = pEVar7;
  }
  if (pEVar13 == pEVar12) {
LAB_004cd679:
    return (int)pEVar12 - iVar5;
  }
  goto LAB_004cd2ef;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t size) const override {
    KJ_IF_SOME(result, DiskHandle::copy(offset, from, fromOffset, size)) {
      return result;
    } else {
      return File::copy(offset, from, fromOffset, size);
    }